

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

int __thiscall
btAlignedObjectArray<btBvhSubtreeInfo>::copy
          (btAlignedObjectArray<btBvhSubtreeInfo> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  long in_RCX;
  btBvhSubtreeInfo *pbVar2;
  int i;
  int local_1c;
  
  for (local_1c = (int)dst; local_1c < (int)src; local_1c = local_1c + 1) {
    puVar1 = (undefined8 *)
             btBvhSubtreeInfo::operator_new(0x20,(void *)(in_RCX + (long)local_1c * 0x20));
    pbVar2 = this->m_data + local_1c;
    *puVar1 = *(undefined8 *)pbVar2;
    puVar1[1] = *(undefined8 *)(pbVar2->m_quantizedAabbMax + 1);
    puVar1[2] = *(undefined8 *)&pbVar2->m_subtreeSize;
    puVar1[3] = *(undefined8 *)(pbVar2->m_padding + 1);
  }
  return local_1c;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}